

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

type_conflict1 __thiscall
llama_model_loader::get_arr_n<unsigned_int>
          (llama_model_loader *this,llm_kv kid,uint *result,bool required)

{
  type_conflict1 tVar1;
  undefined4 in_ESI;
  undefined1 required_00;
  uint *in_RDI;
  string *unaff_retaddr;
  llama_model_loader *in_stack_00000008;
  string local_40 [4];
  llm_kv in_stack_ffffffffffffffc4;
  LLM_KV *in_stack_ffffffffffffffc8;
  
  required_00 = (undefined1)((uint)in_ESI >> 0x18);
  LLM_KV::operator()[abi_cxx11_(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  tVar1 = get_arr_n<unsigned_int>(in_stack_00000008,unaff_retaddr,in_RDI,(bool)required_00);
  std::__cxx11::string::~string(local_40);
  return tVar1;
}

Assistant:

typename std::enable_if<std::is_integral<T>::value, bool>::type
    llama_model_loader::get_arr_n(enum llm_kv kid, T & result, bool required) {
        return get_arr_n(llm_kv(kid), result, required);
    }